

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode wc_statemach(connectdata *conn)

{
  Curl_easy *data;
  void *pvVar1;
  curl_wildcard_dtor p_Var2;
  undefined8 *puVar3;
  Curl_easy *data_00;
  bool bVar4;
  CURLcode CVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  ftp_parselist_data **parserp;
  ftp_parselist_data *pfVar9;
  
  do {
    data = conn->data;
    switch((data->wildcard).state) {
    case CURLWC_CLEAR:
    case CURLWC_ERROR:
    case CURLWC_DONE:
      p_Var2 = (data->wildcard).dtor;
      if (p_Var2 == (curl_wildcard_dtor)0x0) {
        return CURLE_OK;
      }
      (*p_Var2)((data->wildcard).protdata);
      return CURLE_OK;
    case CURLWC_INIT:
      pvVar1 = (data->req).protop;
      pcVar6 = *(char **)((long)pvVar1 + 0x18);
      pcVar8 = strrchr(pcVar6,0x2f);
      if (pcVar8 == (char *)0x0) {
        if (*pcVar6 == '\0') goto LAB_0013e10e;
        pcVar8 = (*Curl_cstrdup)(pcVar6);
        (data->wildcard).pattern = pcVar8;
      }
      else {
        if (pcVar8[1] == '\0') {
LAB_0013e10e:
          (data->wildcard).state = CURLWC_CLEAN;
          CVar5 = ftp_parse_url_path(conn);
          goto LAB_0013e13d;
        }
        pcVar6 = pcVar8 + 1;
        pcVar8 = (*Curl_cstrdup)(pcVar6);
        (data->wildcard).pattern = pcVar8;
      }
      if (pcVar8 == (char *)0x0) {
        CVar5 = CURLE_OUT_OF_MEMORY;
      }
      else {
        *pcVar6 = '\0';
        parserp = (ftp_parselist_data **)(*Curl_ccalloc)(1,0x18);
        CVar5 = CURLE_OUT_OF_MEMORY;
        if (parserp != (ftp_parselist_data **)0x0) {
          pfVar9 = Curl_ftp_parselist_data_alloc();
          *parserp = pfVar9;
          if (pfVar9 != (ftp_parselist_data *)0x0) {
            (data->wildcard).protdata = parserp;
            (data->wildcard).dtor = wc_data_dtor;
            if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
              (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
            }
            CVar5 = ftp_parse_url_path(conn);
            if (CVar5 == CURLE_OK) {
              pcVar6 = (*Curl_cstrdup)(*(char **)((long)pvVar1 + 0x18));
              (data->wildcard).path = pcVar6;
              CVar5 = CURLE_OUT_OF_MEMORY;
              if (pcVar6 != (char *)0x0) {
                data_00 = conn->data;
                parserp[1] = (ftp_parselist_data *)(data_00->set).fwrite_func;
                (data_00->set).fwrite_func = Curl_ftp_parselist;
                parserp[2] = (ftp_parselist_data *)(data_00->set).out;
                (data_00->set).out = conn;
                CVar5 = CURLE_OK;
                Curl_infof(data_00,"Wildcard - Parsing started\n");
                goto LAB_0013e13d;
              }
            }
          }
        }
        if (parserp != (ftp_parselist_data **)0x0) {
          Curl_ftp_parselist_data_free(parserp);
          (*Curl_cfree)(parserp);
        }
        (*Curl_cfree)((data->wildcard).pattern);
        (data->wildcard).pattern = (char *)0x0;
        (data->wildcard).protdata = (void *)0x0;
        (data->wildcard).dtor = (curl_wildcard_dtor)0x0;
      }
LAB_0013e13d:
      if ((data->wildcard).state != CURLWC_CLEAN) {
        (data->wildcard).state = (uint)(CVar5 != CURLE_OK) * 4 + CURLWC_MATCHING;
        return CVar5;
      }
      return CVar5;
    case CURLWC_MATCHING:
      puVar3 = (undefined8 *)(data->wildcard).protdata;
      (data->set).fwrite_func = (curl_write_callback)puVar3[1];
      (data->set).out = (void *)puVar3[2];
      puVar3[1] = 0;
      puVar3[2] = 0;
      (data->wildcard).state = CURLWC_DOWNLOADING;
      CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
      if (CVar5 == CURLE_OK) {
        if ((data->wildcard).filelist.size == 0) {
          (data->wildcard).state = CURLWC_CLEAN;
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else {
        (data->wildcard).state = CURLWC_CLEAN;
      }
      break;
    case CURLWC_DOWNLOADING:
      puVar3 = (undefined8 *)((data->wildcard).filelist.head)->ptr;
      pvVar1 = (data->req).protop;
      pcVar6 = curl_maprintf("%s%s",(data->wildcard).path,*puVar3);
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)(*(void **)((long)pvVar1 + 0x20));
      *(char **)((long)pvVar1 + 0x18) = pcVar6;
      *(char **)((long)pvVar1 + 0x20) = pcVar6;
      Curl_infof(conn->data,"Wildcard - START of \"%s\"\n",*puVar3);
      if ((conn->data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(conn->data,true);
        uVar7 = (*(conn->data->set).chunk_bgn)
                          (puVar3,(data->wildcard).customptr,(int)(data->wildcard).filelist.size);
        bVar4 = false;
        Curl_set_in_callback(conn->data,false);
        if (uVar7 == 1) {
          uVar7 = 0x58;
        }
        else if (uVar7 == 2) {
          bVar4 = false;
          Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar3);
          (data->wildcard).state = CURLWC_SKIP;
          CVar5 = wc_statemach(conn);
          uVar7 = (ulong)CVar5;
        }
        else {
          bVar4 = true;
        }
        if (!bVar4) {
          return (CURLcode)uVar7;
        }
      }
      if (*(int *)(puVar3 + 1) == 0) {
        if ((*(byte *)(puVar3 + 0xc) & 0x40) != 0) {
          (conn->proto).ftpc.known_filesize = puVar3[5];
        }
        CVar5 = ftp_parse_url_path(conn);
        if (CVar5 == CURLE_OK) {
          Curl_llist_remove(&(data->wildcard).filelist,(data->wildcard).filelist.head,(void *)0x0);
          if ((data->wildcard).filelist.size == 0) {
            (data->wildcard).state = CURLWC_CLEAN;
            return CURLE_OK;
          }
          return CURLE_OK;
        }
        return CVar5;
      }
      (data->wildcard).state = CURLWC_SKIP;
      break;
    case CURLWC_CLEAN:
      puVar3 = (undefined8 *)(data->wildcard).protdata;
      CVar5 = CURLE_OK;
      if (puVar3 != (undefined8 *)0x0) {
        CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
      }
      (data->wildcard).state = (CVar5 == CURLE_OK) + CURLWC_ERROR;
      return CVar5;
    case CURLWC_SKIP:
      if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
        Curl_set_in_callback(data,true);
        (*(conn->data->set).chunk_end)((conn->data->wildcard).customptr);
        Curl_set_in_callback(conn->data,false);
      }
      Curl_llist_remove(&(data->wildcard).filelist,(data->wildcard).filelist.head,(void *)0x0);
      (data->wildcard).state = ((data->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
      break;
    default:
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode wc_statemach(struct connectdata *conn)
{
  struct WildcardData * const wildcard = &(conn->data->wildcard);
  CURLcode result = CURLE_OK;

  switch(wildcard->state) {
  case CURLWC_INIT:
    result = init_wc_data(conn);
    if(wildcard->state == CURLWC_CLEAN)
      /* only listing! */
      break;
    wildcard->state = result ? CURLWC_ERROR : CURLWC_MATCHING;
    break;

  case CURLWC_MATCHING: {
    /* In this state is LIST response successfully parsed, so lets restore
       previous WRITEFUNCTION callback and WRITEDATA pointer */
    struct ftp_wc *ftpwc = wildcard->protdata;
    conn->data->set.fwrite_func = ftpwc->backup.write_function;
    conn->data->set.out = ftpwc->backup.file_descriptor;
    ftpwc->backup.write_function = ZERO_NULL;
    ftpwc->backup.file_descriptor = NULL;
    wildcard->state = CURLWC_DOWNLOADING;

    if(Curl_ftp_parselist_geterror(ftpwc->parser)) {
      /* error found in LIST parsing */
      wildcard->state = CURLWC_CLEAN;
      return wc_statemach(conn);
    }
    if(wildcard->filelist.size == 0) {
      /* no corresponding file */
      wildcard->state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    return wc_statemach(conn);
  }

  case CURLWC_DOWNLOADING: {
    /* filelist has at least one file, lets get first one */
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    struct curl_fileinfo *finfo = wildcard->filelist.head->ptr;
    struct FTP *ftp = conn->data->req.protop;

    char *tmp_path = aprintf("%s%s", wildcard->path, finfo->filename);
    if(!tmp_path)
      return CURLE_OUT_OF_MEMORY;

    /* switch default ftp->path and tmp_path */
    free(ftp->pathalloc);
    ftp->pathalloc = ftp->path = tmp_path;

    infof(conn->data, "Wildcard - START of \"%s\"\n", finfo->filename);
    if(conn->data->set.chunk_bgn) {
      long userresponse;
      Curl_set_in_callback(conn->data, true);
      userresponse = conn->data->set.chunk_bgn(
        finfo, wildcard->customptr, (int)wildcard->filelist.size);
      Curl_set_in_callback(conn->data, false);
      switch(userresponse) {
      case CURL_CHUNK_BGN_FUNC_SKIP:
        infof(conn->data, "Wildcard - \"%s\" skipped by user\n",
              finfo->filename);
        wildcard->state = CURLWC_SKIP;
        return wc_statemach(conn);
      case CURL_CHUNK_BGN_FUNC_FAIL:
        return CURLE_CHUNK_FAILED;
      }
    }

    if(finfo->filetype != CURLFILETYPE_FILE) {
      wildcard->state = CURLWC_SKIP;
      return wc_statemach(conn);
    }

    if(finfo->flags & CURLFINFOFLAG_KNOWN_SIZE)
      ftpc->known_filesize = finfo->size;

    result = ftp_parse_url_path(conn);
    if(result)
      return result;

    /* we don't need the Curl_fileinfo of first file anymore */
    Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);

    if(wildcard->filelist.size == 0) { /* remains only one file to down. */
      wildcard->state = CURLWC_CLEAN;
      /* after that will be ftp_do called once again and no transfer
         will be done because of CURLWC_CLEAN state */
      return CURLE_OK;
    }
  } break;

  case CURLWC_SKIP: {
    if(conn->data->set.chunk_end) {
      Curl_set_in_callback(conn->data, true);
      conn->data->set.chunk_end(conn->data->wildcard.customptr);
      Curl_set_in_callback(conn->data, false);
    }
    Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);
    wildcard->state = (wildcard->filelist.size == 0) ?
                      CURLWC_CLEAN : CURLWC_DOWNLOADING;
    return wc_statemach(conn);
  }

  case CURLWC_CLEAN: {
    struct ftp_wc *ftpwc = wildcard->protdata;
    result = CURLE_OK;
    if(ftpwc)
      result = Curl_ftp_parselist_geterror(ftpwc->parser);

    wildcard->state = result ? CURLWC_ERROR : CURLWC_DONE;
  } break;

  case CURLWC_DONE:
  case CURLWC_ERROR:
  case CURLWC_CLEAR:
    if(wildcard->dtor)
      wildcard->dtor(wildcard->protdata);
    break;
  }

  return result;
}